

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

void __thiscall cfd::core::ScriptHash::ScriptHash(ScriptHash *this,string *script_hash)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  this->_vptr_ScriptHash = (_func_int **)&PTR__ScriptHash_00654570;
  StringUtil::StringToByte
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28,
             (string *)script_hash);
  ByteData::ByteData(&this->script_hash_,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

ScriptHash::ScriptHash(const std::string& script_hash)
    : script_hash_(StringUtil::StringToByte(script_hash)) {
  // do nothing
}